

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzer.cpp
# Opt level: O1

void __thiscall I2cAnalyzer::GetByte(I2cAnalyzer *this)

{
  pointer puVar1;
  iterator __position;
  unsigned_long_long uVar2;
  bool bVar3;
  bool bVar4;
  U64 UVar5;
  ulong uVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  bool bVar10;
  FrameV2 framev2;
  DataBuilder byte;
  U64 value;
  BitState ack_bit_state;
  U64 scl_rising_edge;
  U64 potential_ending_sample;
  Frame frame;
  FrameV2 aFStack_98 [8];
  DataBuilder local_90 [8];
  byte local_88 [12];
  BitState local_7c;
  unsigned_long_long local_78;
  BitState local_70 [2];
  U64 local_68;
  unsigned_long_long local_60;
  U64 local_58;
  ulong local_50;
  undefined1 local_40;
  undefined1 local_3f;
  vector<unsigned_long_long,std::allocator<unsigned_long_long>> *local_38;
  
  puVar1 = (this->mArrowLocations).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mArrowLocations).
      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->mArrowLocations).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  DataBuilder::DataBuilder(local_90);
  uVar7 = 0;
  DataBuilder::Reset((ulonglong *)local_90,(ShiftOrder)local_88,0);
  local_38 = (vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)&this->mArrowLocations
  ;
  local_68 = 0;
  bVar10 = false;
  local_78 = 0;
  do {
    bVar3 = GetBitPartOne(this,local_70,&local_60,&local_68);
    bVar4 = GetBitPartTwo(this);
    if (bVar3 && bVar4) {
      __position._M_current =
           (this->mArrowLocations).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->mArrowLocations).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
        _M_realloc_insert<unsigned_long_long_const&>(local_38,__position,&local_60);
      }
      else {
        *__position._M_current = local_60;
        (this->mArrowLocations).
        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      DataBuilder::AddBit((BitState)local_90);
      if (uVar7 == 0) {
        local_78 = local_60;
      }
    }
    if (!bVar3 || !bVar4) break;
    bVar10 = 6 < uVar7;
    uVar7 = uVar7 + 1;
  } while (uVar7 != 8);
  if (bVar10) {
    UVar5 = AnalyzerChannelData::GetSampleNumber();
    bVar10 = GetBitPartOne(this,&local_7c,(U64 *)local_70,&local_68);
    uVar2 = local_78;
    FrameV2::FrameV2(aFStack_98);
    Frame::Frame((Frame *)&local_60);
    local_60 = uVar2;
    local_58 = UVar5;
    if (bVar10) {
      local_58 = local_68;
    }
    local_50 = (ulong)local_88[0];
    if (!bVar10) {
      FrameV2::AddString((char *)aFStack_98,"error");
      local_3f = 2;
    }
    else {
      FrameV2::AddBoolean((char *)aFStack_98,true);
      if (local_7c == BIT_LOW) {
        local_3f = 1;
      }
    }
    if ((bVar10 & this->mNeedAddress) == 1) {
      this->mNeedAddress = false;
      local_40 = 0;
      pcVar8 = "address";
      FrameV2::AddByte((char *)aFStack_98,'\x1a');
      FrameV2::AddBoolean((char *)aFStack_98,true);
    }
    else {
      local_40 = 1;
      pcVar8 = "data";
      FrameV2::AddByte((char *)aFStack_98,'\'');
    }
    AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
    AnalyzerResults::AddFrameV2
              ((FrameV2 *)(this->mResults)._M_ptr,(char *)aFStack_98,(ulonglong)pcVar8,uVar2);
    uVar6 = (ulong)((long)(this->mArrowLocations).
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->mArrowLocations).
                         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3;
    if ((int)uVar6 != 0) {
      uVar9 = 0;
      do {
        AnalyzerResults::AddMarker
                  ((ulonglong)(this->mResults)._M_ptr,
                   (MarkerType)
                   (this->mArrowLocations).
                   super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar9],(Channel *)0x4);
        uVar9 = uVar9 + 1;
      } while ((uVar6 & 0xffffffff) != uVar9);
    }
    AnalyzerResults::CommitResults();
    GetBitPartTwo(this);
    Frame::~Frame((Frame *)&local_60);
    FrameV2::~FrameV2(aFStack_98);
  }
  DataBuilder::~DataBuilder(local_90);
  return;
}

Assistant:

void I2cAnalyzer::GetByte()
{
    mArrowLocations.clear();
    U64 value;
    DataBuilder byte;
    byte.Reset( &value, AnalyzerEnums::MsbFirst, 8 );
    U64 starting_sample = 0;
    U64 potential_ending_sample = 0;

    for( U32 i = 0; i < 8; i++ )
    {
        BitState bit_state;
        U64 scl_rising_edge;
        bool result = GetBitPartOne( bit_state, scl_rising_edge, potential_ending_sample );
        result &= GetBitPartTwo();
        if( result == true )
        {
            mArrowLocations.push_back( scl_rising_edge );
            byte.AddBit( bit_state );

            if( i == 0 )
                starting_sample = scl_rising_edge;
        }
        else
        {
            return;
        }
    }

    BitState ack_bit_state;
    U64 scl_rising_edge;
    S64 last_valid_sample = mScl->GetSampleNumber();
    bool result = GetBitPartOne( ack_bit_state, scl_rising_edge, potential_ending_sample ); // GetBit( ack_bit_state, scl_rising_edge );

    FrameV2 framev2;
    char* framev2Type = nullptr;

    Frame frame;
    frame.mStartingSampleInclusive = starting_sample;
    frame.mEndingSampleInclusive = result ? potential_ending_sample : last_valid_sample;
    frame.mData1 = U8( value );

    if( !result )
    {
        framev2.AddString( "error", "missing ack/nak" );
        frame.mFlags = I2C_MISSING_FLAG_ACK;
    }
    else
    {
        bool ack = ack_bit_state == BIT_LOW;

        // true == ack, false == nak
        framev2.AddBoolean( "ack", ack );
        if( ack )
        {
            frame.mFlags = I2C_FLAG_ACK;
        }
    }

    if( mNeedAddress == true && result == true ) // if result is false, then we have already recorded a stop bit and toggled mNeedAddress
    {
        mNeedAddress = false;
        bool is_read = value & 0x01;
        U8 address = value >> 1;
        frame.mType = I2cAddress;
        framev2Type = "address";
        framev2.AddByte( "address", address );
        framev2.AddBoolean( "read", is_read );
    }
    else
    {
        frame.mType = I2cData;
        framev2Type = "data";
        framev2.AddByte( "data", value );
    }

    mResults->AddFrame( frame );
    mResults->AddFrameV2( framev2, framev2Type, starting_sample, result ? potential_ending_sample : last_valid_sample );

    U32 count = mArrowLocations.size();
    for( U32 i = 0; i < count; i++ )
    {
        mResults->AddMarker( mArrowLocations[ i ], AnalyzerResults::UpArrow, mSettings->mSclChannel );
    }

    mResults->CommitResults();

    result &= GetBitPartTwo();
}